

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

int prvTidyParseConfigFileEnc(TidyDocImpl *doc,ctmbstr file,ctmbstr charenc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  tchar tVar4;
  Bool BVar5;
  ctmbstr __filename;
  FILE *fp;
  StreamIn *pSVar6;
  TidyConfigCallback p_Var7;
  ulong uVar8;
  bool bVar9;
  long lVar10;
  tchar tVar11;
  bool bVar12;
  tmbchar name [64];
  tmbchar buf [8192];
  ulong local_20a0;
  tmbchar local_2078 [8264];
  
  uVar2 = doc->optionErrors;
  __filename = ExpandTilde(doc,file);
  fp = fopen(__filename,"r");
  iVar1 = prvTidyGetCharEncodingFromOptName(charenc);
  if (iVar1 < 0 || fp == (FILE *)0x0) {
    prvTidyReportFileError(doc,__filename,0x23e);
    uVar2 = 0xffffffff;
  }
  else {
    pSVar6 = prvTidyFileInput(doc,(FILE *)fp,iVar1);
    (doc->config).cfgIn = pSVar6;
    if (pSVar6 == (StreamIn *)0x0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = prvTidyReadChar(pSVar6);
    }
    (doc->config).c = uVar3;
    tVar4 = SkipWhite(&doc->config);
    if (tVar4 != 0xffffffff) {
LAB_00134156:
      local_2078[0x30] = '\0';
      local_2078[0x31] = '\0';
      local_2078[0x32] = '\0';
      local_2078[0x33] = '\0';
      local_2078[0x34] = '\0';
      local_2078[0x35] = '\0';
      local_2078[0x36] = '\0';
      local_2078[0x37] = '\0';
      local_2078[0x38] = '\0';
      local_2078[0x39] = '\0';
      local_2078[0x3a] = '\0';
      local_2078[0x3b] = '\0';
      local_2078[0x3c] = '\0';
      local_2078[0x3d] = '\0';
      local_2078[0x3e] = '\0';
      local_2078[0x3f] = '\0';
      local_2078[0x20] = '\0';
      local_2078[0x21] = '\0';
      local_2078[0x22] = '\0';
      local_2078[0x23] = '\0';
      local_2078[0x24] = '\0';
      local_2078[0x25] = '\0';
      local_2078[0x26] = '\0';
      local_2078[0x27] = '\0';
      local_2078[0x28] = '\0';
      local_2078[0x29] = '\0';
      local_2078[0x2a] = '\0';
      local_2078[0x2b] = '\0';
      local_2078[0x2c] = '\0';
      local_2078[0x2d] = '\0';
      local_2078[0x2e] = '\0';
      local_2078[0x2f] = '\0';
      local_2078[0x10] = '\0';
      local_2078[0x11] = '\0';
      local_2078[0x12] = '\0';
      local_2078[0x13] = '\0';
      local_2078[0x14] = '\0';
      local_2078[0x15] = '\0';
      local_2078[0x16] = '\0';
      local_2078[0x17] = '\0';
      local_2078[0x18] = '\0';
      local_2078[0x19] = '\0';
      local_2078[0x1a] = '\0';
      local_2078[0x1b] = '\0';
      local_2078[0x1c] = '\0';
      local_2078[0x1d] = '\0';
      local_2078[0x1e] = '\0';
      local_2078[0x1f] = '\0';
      local_2078[0] = '\0';
      local_2078[1] = '\0';
      local_2078[2] = '\0';
      local_2078[3] = '\0';
      local_2078[4] = '\0';
      local_2078[5] = '\0';
      local_2078[6] = '\0';
      local_2078[7] = '\0';
      local_2078[8] = '\0';
      local_2078[9] = '\0';
      local_2078[10] = '\0';
      local_2078[0xb] = '\0';
      local_2078[0xc] = '\0';
      local_2078[0xd] = '\0';
      local_2078[0xe] = '\0';
      local_2078[0xf] = '\0';
      if ((tVar4 != 0x23) && (tVar4 != 0x2f)) {
        lVar10 = -0x3e;
        do {
          if ((tVar4 == 0xffffffff) || (tVar4 == 10)) break;
          if (tVar4 == 0x3a) {
LAB_00134280:
            uVar8 = 0;
            goto LAB_00134282;
          }
          local_2078[lVar10 + 0x3e] = (tmbchar)tVar4;
          if ((doc->config).c == 0xffffffff) {
            tVar4 = 0xffffffff;
            if (lVar10 == 0) break;
          }
          else {
            pSVar6 = (doc->config).cfgIn;
            if (pSVar6 == (StreamIn *)0x0) {
              tVar4 = 0xffffffff;
            }
            else {
              tVar4 = prvTidyReadChar(pSVar6);
            }
            (doc->config).c = tVar4;
            if (lVar10 == 0) {
              if (tVar4 == 0x3a) goto LAB_00134280;
              break;
            }
          }
          lVar10 = lVar10 + 1;
        } while( true );
      }
      goto LAB_0013417b;
    }
LAB_001344b6:
    prvTidyfreeFileSource(&((doc->config).cfgIn)->source,yes);
    prvTidyfreeStreamIn((doc->config).cfgIn);
    (doc->config).cfgIn = (StreamIn *)0x0;
    if (__filename != file) {
      (*doc->allocator->vtbl->free)(doc->allocator,__filename);
    }
    AdjustConfig(doc);
    uVar2 = (uint)(uVar2 < doc->optionErrors);
  }
  return uVar2;
  while (bVar9 = uVar8 < 0x1688, uVar8 = uVar8 + 0x38, bVar9) {
LAB_00134282:
    iVar1 = prvTidytmbstrcasecmp(local_2078,*(ctmbstr *)((long)&option_defs[0].name + uVar8));
    if (iVar1 == 0) {
      lVar10 = (long)&option_defs[0].id + uVar8;
      goto LAB_001342b8;
    }
  }
  lVar10 = 0;
LAB_001342b8:
  if ((doc->config).c != 0xffffffff) {
    pSVar6 = (doc->config).cfgIn;
    if (pSVar6 == (StreamIn *)0x0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = prvTidyReadChar(pSVar6);
    }
    (doc->config).c = uVar3;
  }
  if (lVar10 != 0) {
    (**(code **)(lVar10 + 0x20))(doc,lVar10);
    goto LAB_0013417b;
  }
  if ((doc->pOptCallback != (TidyOptCallback)0x0) ||
     (doc->pConfigCallback != (TidyConfigCallback)0x0)) {
    tVar4 = SkipWhite(&doc->config);
    if ((tVar4 == 0x27) || (tVar11 = 0, tVar4 == 0x22)) {
      tVar11 = tVar4;
      if ((doc->config).c == 0xffffffff) {
        tVar4 = 0xffffffff;
      }
      else {
        pSVar6 = (doc->config).cfgIn;
        if (pSVar6 == (StreamIn *)0x0) {
          tVar4 = 0xffffffff;
        }
        else {
          tVar4 = prvTidyReadChar(pSVar6);
        }
        (doc->config).c = tVar4;
      }
    }
    bVar12 = true;
    local_20a0 = 0;
    bVar9 = false;
    do {
      while( true ) {
        if (((tVar4 + 1 < 0xf) && ((0x4801U >> (tVar4 + 1 & 0x1f) & 1) != 0)) ||
           ((tVar11 != 0 && (tVar4 == tVar11)))) goto LAB_0013443d;
        BVar5 = prvTidyIsWhite(tVar4);
        if (BVar5 != no) break;
LAB_001343d9:
        local_2078[local_20a0 + 0x40] = (tmbchar)tVar4;
        if ((doc->config).c == 0xffffffff) {
          tVar4 = 0xffffffff;
        }
        else {
          pSVar6 = (doc->config).cfgIn;
          if (pSVar6 == (StreamIn *)0x0) {
            tVar4 = 0xffffffff;
          }
          else {
            tVar4 = prvTidyReadChar(pSVar6);
          }
          (doc->config).c = tVar4;
        }
        bVar12 = local_20a0 < 0x1ffd;
        local_20a0 = local_20a0 + 1;
        bVar9 = true;
        if (local_20a0 == 0x1ffe) {
          local_20a0 = 0x1ffe;
          goto LAB_00134441;
        }
      }
      if (bVar9) {
        tVar4 = 0x20;
        goto LAB_001343d9;
      }
      if ((doc->config).c == 0xffffffff) {
        tVar4 = 0xffffffff;
      }
      else {
        pSVar6 = (doc->config).cfgIn;
        if (pSVar6 == (StreamIn *)0x0) {
          tVar4 = 0xffffffff;
        }
        else {
          tVar4 = prvTidyReadChar(pSVar6);
        }
        (doc->config).c = tVar4;
      }
      bVar9 = false;
    } while (bVar12);
LAB_0013443d:
    local_20a0 = local_20a0 & 0xffffffff;
LAB_00134441:
    local_2078[local_20a0 + 0x40] = '\0';
    if (doc->pOptCallback == (TidyOptCallback)0x0) {
      p_Var7 = doc->pConfigCallback;
      if (p_Var7 != (TidyConfigCallback)0x0) goto LAB_00134488;
    }
    else {
      BVar5 = (*doc->pOptCallback)(local_2078,local_2078 + 0x40);
      p_Var7 = doc->pConfigCallback;
      if (p_Var7 != (TidyConfigCallback)0x0) {
        if (BVar5 != no) goto LAB_0013417b;
LAB_00134488:
        BVar5 = (*p_Var7)((TidyDoc)doc,local_2078,local_2078 + 0x40);
        BVar5 = (Bool)(BVar5 != no);
      }
      if (BVar5 != no) goto LAB_0013417b;
    }
  }
  prvTidyReportUnknownOption(doc,local_2078);
LAB_0013417b:
  do {
    uVar3 = (doc->config).c;
    while( true ) {
      if ((uVar3 == 0xffffffff) || (uVar3 == 10)) goto LAB_001341ce;
      if (uVar3 == 0xd) break;
      pSVar6 = (doc->config).cfgIn;
      if (pSVar6 == (StreamIn *)0x0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = prvTidyReadChar(pSVar6);
      }
      (doc->config).c = uVar3;
    }
    pSVar6 = (doc->config).cfgIn;
    if (pSVar6 == (StreamIn *)0x0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = prvTidyReadChar(pSVar6);
    }
    (doc->config).c = uVar3;
LAB_001341ce:
    if (uVar3 == 10) {
      pSVar6 = (doc->config).cfgIn;
      if (pSVar6 == (StreamIn *)0x0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = prvTidyReadChar(pSVar6);
      }
      (doc->config).c = uVar3;
    }
    BVar5 = prvTidyIsWhite(uVar3);
  } while (BVar5 != no);
  tVar4 = (doc->config).c;
  if (tVar4 == 0xffffffff) goto LAB_001344b6;
  goto LAB_00134156;
}

Assistant:

int TY_(ParseConfigFileEnc)( TidyDocImpl* doc, ctmbstr file, ctmbstr charenc )
{
    enum { tidy_max_name = 64 };
    uint opterrs = doc->optionErrors;
    tmbstr fname = (tmbstr) ExpandTilde( doc, file );
    TidyConfigImpl* cfg = &doc->config;
    FILE* fin = fopen( fname, "r" );
    int enc = TY_(CharEncodingId)( doc, charenc );

    if ( fin == NULL || enc < 0 )
    {
        TY_(ReportFileError)( doc, fname, FILE_CANT_OPEN_CFG );
        return -1;
    }
    else
    {
        tchar c;
        cfg->cfgIn = TY_(FileInput)( doc, fin, enc );
        c = FirstChar( cfg );
       
        for ( c = SkipWhite(cfg); c != EndOfStream; c = NextProperty(cfg) )
        {
            uint ix = 0;
            tmbchar name[ tidy_max_name ] = {0};

            /* // or # start a comment */
            if ( c == '/' || c == '#' )
                continue;

            while ( ix < sizeof(name)-1 && c != '\n' && c != EndOfStream && c != ':' )
            {
                name[ ix++ ] = (tmbchar) c;  /* Option names all ASCII */
                c = AdvanceChar( cfg );
            }

            if ( c == ':' )
            {
                Bool isDeprecated = isOptionDeprecated( name );
                const TidyOptionImpl* option = TY_(lookupOption)( name );
                c = AdvanceChar( cfg );
                if ( option && !isDeprecated )
                    option->parser( doc, option );
                else
                {
                    if ( (NULL != doc->pOptCallback) || (NULL != doc->pConfigCallback) || isDeprecated )
                    {
                        TidyConfigImpl* cfg = &doc->config;
                        tmbchar buf[8192];
                        uint i = 0;
                        tchar delim = 0;
                        Bool waswhite = yes;
                        Bool response = no;

                        tchar c = SkipWhite( cfg );

                        if ( c == '"' || c == '\'' )
                        {
                            delim = c;
                            c = AdvanceChar( cfg );
                        }

                        while ( i < sizeof(buf)-2 && c != EndOfStream && c != '\r' && c != '\n' )
                        {
                            if ( delim && c == delim )
                                break;

                            if ( TY_(IsWhite)(c) )
                            {
                                if ( waswhite )
                                {
                                    c = AdvanceChar( cfg );
                                    continue;
                                }
                                c = ' ';
                            }
                            else
                                waswhite = no;

                            buf[i++] = (tmbchar) c;
                            c = AdvanceChar( cfg );
                        }
                        buf[i] = '\0';
                        
                        if ( doc->pOptCallback )
                            response = (*doc->pOptCallback)( name, buf );

                        if ( doc->pConfigCallback )
                            response = response || (*doc->pConfigCallback)( tidyImplToDoc(doc), name, buf );

                        if ( !response && isDeprecated )
                            response = subDeprecatedOption( doc, name, buf);

                        if ( response == no )
                            TY_(ReportUnknownOption)( doc, name );
                    }
                    else
                        TY_(ReportUnknownOption)( doc, name );
                }
            }
        }

        TY_(freeFileSource)(&cfg->cfgIn->source, yes);
        TY_(freeStreamIn)( cfg->cfgIn );
        cfg->cfgIn = NULL;
    }

    if ( fname != (tmbstr) file )
        TidyDocFree( doc, fname );

    AdjustConfig( doc );

    /* any new config errors? If so, return warning status. */
    return (doc->optionErrors > opterrs ? 1 : 0); 
}